

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O0

PipelineResourceDesc * __thiscall
Diligent::ShaderVariableManagerVk::GetResourceDesc(ShaderVariableManagerVk *this,Uint32 Index)

{
  Char *Message;
  PipelineResourceDesc *pPVar1;
  char (*in_RCX) [13];
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  ShaderVariableManagerVk *this_local;
  
  msg.field_2._12_4_ = Index;
  if ((this->
      super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>)
      .m_pSignature == (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[13]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pSignature",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0xa2);
    std::__cxx11::string::~string((string *)local_38);
  }
  pPVar1 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                     (&((this->
                        super_ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
                        ).m_pSignature)->
                       super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                      msg.field_2._12_4_);
  return pPVar1;
}

Assistant:

const PipelineResourceDesc& ShaderVariableManagerVk::GetResourceDesc(Uint32 Index) const
{
    VERIFY_EXPR(m_pSignature);
    return m_pSignature->GetResourceDesc(Index);
}